

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

void Llb_Nonlin4SweepDeref(DdManager *dd,Vec_Ptr_t *vParts)

{
  int iVar1;
  DdNode *n;
  undefined4 local_24;
  int i;
  DdNode *bFunc;
  Vec_Ptr_t *vParts_local;
  DdManager *dd_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(vParts), local_24 < iVar1; local_24 = local_24 + 1) {
    n = (DdNode *)Vec_PtrEntry(vParts,local_24);
    Cudd_RecursiveDeref(dd,n);
  }
  Vec_PtrFree(vParts);
  return;
}

Assistant:

void Llb_Nonlin4SweepDeref( DdManager * dd, Vec_Ptr_t * vParts )
{
    DdNode * bFunc;
    int i;
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vParts );
}